

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status curi_parse_full_uri(char *uri,size_t len,curi_settings *settings,void *userData)

{
  curi_status cVar1;
  char *pcVar2;
  size_t offset;
  curi_settings defaultSettings;
  size_t local_b0;
  curi_settings local_a8;
  
  local_b0 = 0;
  if (settings == (curi_settings *)0x0) {
    settings = &local_a8;
    memset(settings,0,0x88);
    local_a8.allocate = default_allocate;
    local_a8.deallocate = default_deallocate;
    local_a8.query_item_separator = '&';
    local_a8.query_item_key_separator = '=';
  }
  cVar1 = parse_full_uri(uri,len,&local_b0,settings,userData);
  if (cVar1 == curi_status_success) {
    pcVar2 = "";
    if (local_b0 < len) {
      pcVar2 = uri + local_b0;
    }
    cVar1 = (uint)(*pcVar2 != '\0') * 2;
  }
  return cVar1;
}

Assistant:

curi_status curi_parse_full_uri(const char* uri, size_t len, const curi_settings* settings /*= 0*/, void* userData /*= 0*/)
{
    size_t offset = 0;
    curi_status status;

    if (settings)
    {
        // parsing with the given settings
        status = parse_full_uri(uri, len, &offset, settings, userData);
    }
    else
    {
        curi_settings defaultSettings;
        curi_default_settings(&defaultSettings);
        // parsing with default settings
        status = parse_full_uri(uri, len, &offset, &defaultSettings, userData);
    }

    if (status == curi_status_success && *read_char(uri,len,&offset) != '\0')
        // the URI weren't fully consumed
        // TODO: set an error string somewhere
        status = curi_status_error;

    return status;
}